

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallScriptGenerator::GetScript
          (string *__return_storage_ptr__,cmInstallScriptGenerator *this,string *config)

{
  string local_78;
  string local_58;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->AllowGenex == true) &&
     ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == true)) {
    std::__cxx11::string::string((string *)&local_58,(string *)&this->Script);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_38,&local_58,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_78);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallScriptGenerator::GetScript(
  std::string const& config) const
{
  std::string script;
  if (this->AllowGenex && this->ActionsPerConfig) {
    script = cmGeneratorExpression::Evaluate(this->Script,
                                             this->LocalGenerator, config);
  } else {
    script = this->Script;
  }
  return script;
}